

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::SInt64Size(RepeatedField<long> *value)

{
  long *plVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  int index;
  
  sVar4 = 0;
  iVar3 = value->current_size_;
  if (value->current_size_ < 1) {
    iVar3 = 0;
  }
  for (index = 0; iVar3 != index; index = index + 1) {
    plVar1 = RepeatedField<long>::Get(value,index);
    sVar2 = SInt64Size(*plVar1);
    sVar4 = sVar4 + sVar2;
  }
  return sVar4;
}

Assistant:

size_t WireFormatLite::SInt64Size(const RepeatedField<int64>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += SInt64Size(value.Get(i));
  }
  return out;
}